

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void discrete_dist_test_pdf<trng::geometric_dist>(geometric_dist *d)

{
  double dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double local_e0;
  double local_d8;
  SourceLineInfo local_d0;
  double diff;
  StringRef local_b8;
  BinaryExpr<const_double_&,_const_double_&> local_a8;
  AssertionHandler catchAssertionHandler;
  
  iVar2 = 0;
  local_e0 = (d->P).q_;
  iVar3 = 0;
  while (local_e0 = 1.0 - local_e0, local_e0 < 0.95) {
    dVar5 = (d->P).q_;
    bVar4 = iVar2 != 0;
    iVar2 = iVar2 + -1;
    if (bVar4) {
      dVar5 = pow(dVar5,(double)iVar3);
      local_e0 = local_e0 + dVar5 + -1.0;
      dVar5 = (d->P).q_;
    }
    dVar1 = (d->P).p_;
    dVar5 = pow(dVar5,(double)iVar3);
    diff = local_e0 - dVar5 * dVar1;
    local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x2602f7;
    local_a8.super_ITransientExpression.m_isBinaryExpression = true;
    local_a8.super_ITransientExpression.m_result = false;
    local_a8.super_ITransientExpression._10_6_ = 0;
    local_d0.file =
         "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
    ;
    local_d0.line = 0xeb;
    Catch::StringRef::StringRef(&local_b8,"diff < 128 * std::numeric_limits<double>::epsilon()");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_a8,&local_d0,local_b8,Normal);
    local_d0.file = (char *)&diff;
    local_d8 = 2.842170943040401e-14;
    Catch::ExprLhs<double_const&>::operator<
              (&local_a8,(ExprLhs<double_const&> *)&local_d0,&local_d8);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a8.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_e0 = pow((d->P).q_,(double)(iVar3 + 2));
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void discrete_dist_test_pdf(dist &d) {
  int i{d.min()};
  double P{d.cdf(i)};
  while (P < 0.95) {
    double p{P};
    if (i > d.min())
      p -= d.cdf(i - 1);
    const double diff{p - d.pdf(i)};
    REQUIRE(diff < 128 * std::numeric_limits<double>::epsilon());
    ++i;
    P = d.cdf(i);
  }
}